

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O3

void __thiscall EPoller::updateChannel(EPoller *this,ChannelPtr *channel)

{
  ChannelMap *this_00;
  element_type *peVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  Logger local_1008;
  epoll_event local_30;
  int fd;
  
  local_30.data.u64._4_4_ =
       ((channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->fd_;
  this_00 = &this->channels_;
  iVar3 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)((long)&local_30.data + 4));
  if (iVar3.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>._M_cur
      == (__node_type *)0x0) {
    __assert_fail("channels_.find(fd) != channels_.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                  ,0x44,"void EPoller::updateChannel(ChannelPtr)");
  }
  pmVar4 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)((long)&local_30.data + 4));
  peVar1 = (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((pmVar4->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == peVar1) {
    local_30.data.fd = 0;
    local_30.events = peVar1->events_;
    local_30._4_4_ = local_30.data.u64._4_4_;
    iVar2 = epoll_ctl(this->epollfd_,3,local_30.data.u64._4_4_,&local_30);
    if (iVar2 < 0) {
      Logger::Logger(&local_1008,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                     ,0x4c);
      if (0xf < ((int)&local_1008 + 0xfa8) - (int)local_1008.impl_.stream_.buffer_.cur_) {
        builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"epoll_mod error",0xf);
        local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0xf;
      }
      Logger::~Logger(&local_1008);
      std::
      _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&this_00->_M_h,(undefined1 *)((long)&local_30.data + 4));
    }
    return;
  }
  __assert_fail("channels_[fd] == channel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                ,0x45,"void EPoller::updateChannel(ChannelPtr)");
}

Assistant:

void EPoller::updateChannel(ChannelPtr channel) {
    int fd = channel->fd();
    // LOG << "Epoll MOD fd = " << fd;
    
    assert(channels_.find(fd) != channels_.end());
    assert(channels_[fd] == channel);

    struct epoll_event event;
    memset(&event, 0, sizeof event);
    event.events = channel->events();
    event.data.fd = fd;
    if (epoll_ctl(epollfd_, EPOLL_CTL_MOD, fd, &event) < 0) {
        LOG << "epoll_mod error";
        channels_.erase(fd);
    }
}